

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

Data * __thiscall
QTzTimeZonePrivate::dataFromRule
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,QTzTransitionRule rule,
          qint64 msecsSinceEpoch)

{
  QByteArray *pQVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = rule._8_4_ & 0xff;
  pQVar1 = (this->cached_data).m_abbreviations.d.ptr;
  ba.m_data = (storage_type *)pQVar1;
  ba.m_size = (qsizetype)pQVar1[uVar4].d.ptr;
  QString::fromUtf8(&local_48,(QString *)pQVar1[uVar4].d.size,ba);
  iVar2 = rule.stdOffset;
  iVar3 = rule.dstOffset;
  (__return_storage_ptr__->abbreviation).d.d = local_48.d.d;
  (__return_storage_ptr__->abbreviation).d.ptr = local_48.d.ptr;
  (__return_storage_ptr__->abbreviation).d.size = local_48.d.size;
  if (&(local_48.d.d)->super_QArrayData == (QArrayData *)0x0) {
    __return_storage_ptr__->atMSecsSinceEpoch = msecsSinceEpoch;
    __return_storage_ptr__->offsetFromUtc = iVar2 + iVar3;
    __return_storage_ptr__->standardTimeOffset = iVar2;
    __return_storage_ptr__->daylightTimeOffset = iVar3;
  }
  else {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    __return_storage_ptr__->atMSecsSinceEpoch = msecsSinceEpoch;
    __return_storage_ptr__->offsetFromUtc = iVar2 + iVar3;
    __return_storage_ptr__->standardTimeOffset = iVar2;
    __return_storage_ptr__->daylightTimeOffset = iVar3;
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::dataFromRule(QTzTransitionRule rule,
                                                        qint64 msecsSinceEpoch) const
{
    return Data(QString::fromUtf8(cached_data.m_abbreviations.at(rule.abbreviationIndex)),
                msecsSinceEpoch, rule.stdOffset + rule.dstOffset, rule.stdOffset);
}